

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid,REF_INT node)

{
  REF_GEOM ref_geom;
  REF_ADJ pRVar1;
  REF_NODE ref_node;
  REF_CELL pRVar2;
  REF_ADJ_ITEM pRVar3;
  bool bVar4;
  uint uVar5;
  REF_INT *pRVar6;
  REF_INT RVar7;
  uint uVar8;
  undefined8 uVar9;
  ulong uVar10;
  char *pcVar11;
  ulong uVar12;
  REF_INT nodes [27];
  
  ref_geom = ref_grid->geom;
  uVar12 = 0xffffffff;
  RVar7 = -1;
  if (-1 < node) {
    pRVar1 = ref_geom->ref_adj;
    uVar12 = 0xffffffff;
    RVar7 = -1;
    if (node < pRVar1->nnode) {
      uVar8 = pRVar1->first[(uint)node];
      uVar12 = 0xffffffff;
      RVar7 = -1;
      if ((long)(int)uVar8 != -1) {
        RVar7 = pRVar1->item[(int)uVar8].ref;
        uVar12 = (ulong)uVar8;
      }
    }
  }
  ref_node = ref_grid->node;
  do {
    if ((int)uVar12 == -1) {
      return 0;
    }
    pRVar6 = ref_geom->descr;
    uVar8 = RVar7 * 6;
    if (pRVar6[(int)uVar8] == 1) {
      pRVar2 = ref_grid->cell[0];
      uVar10 = 0xffffffff;
      RVar7 = -1;
      if (-1 < node) {
        pRVar1 = pRVar2->ref_adj;
        uVar10 = 0xffffffff;
        RVar7 = -1;
        if (node < pRVar1->nnode) {
          uVar5 = pRVar1->first[(uint)node];
          uVar10 = 0xffffffff;
          RVar7 = -1;
          if ((long)(int)uVar5 != -1) {
            RVar7 = pRVar1->item[(int)uVar5].ref;
            uVar10 = (ulong)uVar5;
          }
        }
      }
      bVar4 = false;
      while ((int)uVar10 != -1) {
        uVar5 = ref_cell_nodes(pRVar2,RVar7,nodes);
        if (uVar5 != 0) {
          pcVar11 = "edg nodes";
          uVar9 = 0x843;
          goto LAB_001812f4;
        }
        pRVar6 = ref_geom->descr;
        if (pRVar6[(int)(uVar8 | 1)] == nodes[pRVar2->node_per]) {
          bVar4 = true;
        }
        pRVar3 = pRVar2->ref_adj->item;
        uVar10 = (ulong)pRVar3[(int)uVar10].next;
        RVar7 = -1;
        if (uVar10 != 0xffffffffffffffff) {
          RVar7 = pRVar3[uVar10].ref;
        }
      }
      if (!bVar4) {
        uVar5 = ref_node_location(ref_node,node);
        if (uVar5 != 0) {
          pcVar11 = "loc";
          uVar9 = 0x849;
          goto LAB_001812f4;
        }
        ref_geom_tattle(ref_geom,node);
        uVar5 = ref_cell_tattle_about(pRVar2,node);
        if (uVar5 != 0) {
          pcVar11 = "cell tatt";
          uVar9 = 0x84b;
          goto LAB_001812f4;
        }
        pRVar6 = ref_geom->descr;
      }
    }
    if (pRVar6[(int)uVar8] == 2) {
      pRVar2 = ref_grid->cell[3];
      uVar10 = 0xffffffff;
      RVar7 = -1;
      if (-1 < node) {
        pRVar1 = pRVar2->ref_adj;
        uVar10 = 0xffffffff;
        RVar7 = -1;
        if (node < pRVar1->nnode) {
          uVar5 = pRVar1->first[(uint)node];
          uVar10 = 0xffffffff;
          RVar7 = -1;
          if ((long)(int)uVar5 != -1) {
            RVar7 = pRVar1->item[(int)uVar5].ref;
            uVar10 = (ulong)uVar5;
          }
        }
      }
      bVar4 = false;
      while ((int)uVar10 != -1) {
        uVar5 = ref_cell_nodes(pRVar2,RVar7,nodes);
        if (uVar5 != 0) {
          pcVar11 = "tri nodes";
          uVar9 = 0x852;
          goto LAB_001812f4;
        }
        if (ref_geom->descr[(int)(uVar8 | 1)] == nodes[pRVar2->node_per]) {
          bVar4 = true;
        }
        pRVar3 = pRVar2->ref_adj->item;
        uVar10 = (ulong)pRVar3[(int)uVar10].next;
        RVar7 = -1;
        if (uVar10 != 0xffffffffffffffff) {
          RVar7 = pRVar3[uVar10].ref;
        }
      }
      if (!bVar4) {
        uVar5 = ref_node_location(ref_node,node);
        if (uVar5 != 0) {
          pcVar11 = "loc";
          uVar9 = 0x858;
LAB_001812f4:
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 uVar9,"ref_geom_report_topo_at",(ulong)uVar5,pcVar11);
          return uVar5;
        }
        ref_geom_tattle(ref_geom,node);
        uVar5 = ref_cell_tattle_about(pRVar2,node);
        if (uVar5 != 0) {
          pcVar11 = "cell tatt";
          uVar9 = 0x85a;
          goto LAB_001812f4;
        }
      }
    }
    pRVar3 = ref_geom->ref_adj->item;
    uVar12 = (ulong)pRVar3[(int)uVar12].next;
    RVar7 = -1;
    if (uVar12 != 0xffffffffffffffff) {
      RVar7 = pRVar3[uVar12].ref;
    }
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_geom_report_topo_at(REF_GRID ref_grid, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell;
  REF_INT geom_item, geom;
  REF_INT cell_item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT have_match;

  each_ref_geom_having_node(ref_geom, node, geom_item, geom) {
    if (REF_GEOM_EDGE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_edg(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "edg nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
    if (REF_GEOM_FACE == ref_geom_type(ref_geom, geom)) {
      have_match = REF_FALSE;
      ref_cell = ref_grid_tri(ref_grid);
      each_ref_cell_having_node(ref_cell, node, cell_item, cell) {
        RSS(ref_cell_nodes(ref_cell, cell, nodes), "tri nodes");
        if (ref_geom_id(ref_geom, geom) == nodes[ref_cell_id_index(ref_cell)]) {
          have_match = REF_TRUE;
        }
      }
      if (!have_match) {
        RSS(ref_node_location(ref_node, node), "loc");
        RSS(ref_geom_tattle(ref_geom, node), "geom tatt");
        RSS(ref_cell_tattle_about(ref_cell, node), "cell tatt");
      }
    }
  }

  return REF_SUCCESS;
}